

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O1

bool __thiscall jrtplib::RTPUDPv6Transmitter::SetMulticastTTL(RTPUDPv6Transmitter *this,uint8_t ttl)

{
  int iVar1;
  undefined7 in_register_00000031;
  bool bVar2;
  int ttl2;
  undefined4 local_c;
  
  local_c = (undefined4)CONCAT71(in_register_00000031,ttl);
  iVar1 = setsockopt(this->rtpsock,0x29,0x12,&local_c,4);
  if (iVar1 == 0) {
    iVar1 = setsockopt(this->rtcpsock,0x29,0x12,&local_c,4);
    bVar2 = iVar1 == 0;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool RTPUDPv6Transmitter::SetMulticastTTL(uint8_t ttl)
{
	int ttl2,status;

	ttl2 = (int)ttl;
	status = setsockopt(rtpsock,IPPROTO_IPV6,IPV6_MULTICAST_HOPS,(const char *)&ttl2,sizeof(int));
	if (status != 0)
		return false;
	status = setsockopt(rtcpsock,IPPROTO_IPV6,IPV6_MULTICAST_HOPS,(const char *)&ttl2,sizeof(int));
	if (status != 0)
		return false;
	return true;
}